

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glcViewportArrayTests.cpp
# Opt level: O0

GLuint __thiscall
glcts::ViewportArray::Utils::program::getSubroutineIndex
          (program *this,GLchar *subroutine_name,GLenum shader_stage)

{
  int iVar1;
  deUint32 err;
  RenderContext *pRVar2;
  undefined4 extraout_var;
  TestContext *this_00;
  TestLog *this_01;
  MessageBuilder *pMVar3;
  TestError *this_02;
  MessageBuilder local_1b0;
  GLuint local_2c;
  long lStack_28;
  GLuint index;
  Functions *gl;
  GLchar *pGStack_18;
  GLenum shader_stage_local;
  GLchar *subroutine_name_local;
  program *this_local;
  
  gl._4_4_ = shader_stage;
  pGStack_18 = subroutine_name;
  subroutine_name_local = (GLchar *)this;
  pRVar2 = deqp::Context::getRenderContext(this->m_context);
  iVar1 = (*pRVar2->_vptr_RenderContext[3])();
  lStack_28 = CONCAT44(extraout_var,iVar1);
  local_2c = 0xffffffff;
  local_2c = (**(code **)(lStack_28 + 0xa88))(this->m_program_object_id,gl._4_4_,pGStack_18);
  err = (**(code **)(lStack_28 + 0x800))();
  glu::checkError(err,"GetSubroutineIndex",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcViewportArrayTests.cpp"
                  ,0x1ca);
  if (local_2c == 0xffffffff) {
    this_00 = deqp::Context::getTestContext(this->m_context);
    this_01 = tcu::TestContext::getLog(this_00);
    tcu::TestLog::operator<<(&local_1b0,this_01,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar3 = tcu::MessageBuilder::operator<<(&local_1b0,(char (*) [13])0x2a0b36b);
    pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,&stack0xffffffffffffffe8);
    pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(char (*) [18])0x2a09a03);
    tcu::MessageBuilder::operator<<(pMVar3,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_1b0);
    this_02 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this_02,"Subroutine is not available",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcViewportArrayTests.cpp"
               ,0x1d1);
    __cxa_throw(this_02,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
  }
  return local_2c;
}

Assistant:

GLuint Utils::program::getSubroutineIndex(const glw::GLchar* subroutine_name, glw::GLenum shader_stage) const
{
	const glw::Functions& gl	= m_context.getRenderContext().getFunctions();
	GLuint				  index = -1;

	index = gl.getSubroutineIndex(m_program_object_id, shader_stage, subroutine_name);
	GLU_EXPECT_NO_ERROR(gl.getError(), "GetSubroutineIndex");

	if (GL_INVALID_INDEX == index)
	{
		m_context.getTestContext().getLog() << tcu::TestLog::Message << "Subroutine: " << subroutine_name
											<< " is not available" << tcu::TestLog::EndMessage;

		TCU_FAIL("Subroutine is not available");
	}

	return index;
}